

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *
libtorrent::anon_unknown_40::convert_file_storage
          (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
           *__return_storage_ptr__,file_storage *fs)

{
  file_flags_t fVar1;
  int iVar2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar3;
  int64_t sz;
  time_t ts;
  string *__args_4;
  ulong uVar4;
  file_index_t index;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_112;
  allocator<char> local_111;
  vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *local_110;
  int local_104;
  time_t local_100;
  file_storage *local_f8;
  ulong local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  create_file_entry local_88;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = file_storage::num_files(fs);
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  reserve(__return_storage_ptr__,(long)iVar2);
  iVar3 = file_storage::file_range(fs);
  uVar4 = (ulong)iVar3 >> 0x20;
  local_110 = (vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *
              )__return_storage_ptr__;
  local_f8 = fs;
  local_f0 = uVar4;
  while (index.m_val = (int)iVar3._begin.m_val, (int)uVar4 != index.m_val) {
    fVar1 = file_storage::file_flags(fs,index);
    if ((fVar1.m_val & 8) == 0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"",(allocator<char> *)&local_100);
      file_storage::file_path(&local_c8,fs,index,&local_a8);
      sz = file_storage::file_size(fs,index);
      fVar1 = file_storage::file_flags(fs,index);
      ts = file_storage::mtime(fs,index);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      create_file_entry::create_file_entry(&local_88,&local_c8,sz,fVar1,ts,&local_e8);
      __return_storage_ptr__ =
           (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *)
           local_110;
      ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
      emplace_back<libtorrent::create_file_entry>
                ((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  *)local_110,&local_88);
      create_file_entry::~create_file_entry(&local_88);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      fs = local_f8;
      uVar4 = local_f0;
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_111);
      file_storage::file_path(&local_88.filename,fs,index,&local_a8);
      local_104 = 0;
      local_112.m_val = (uchar)file_storage::file_flags(fs,index);
      local_100 = file_storage::mtime(fs,index);
      __args_4 = file_storage::internal_symlink_abi_cxx11_(fs,index);
      ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
      emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>,long,std::__cxx11::string_const&>
                ((vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
                  *)__return_storage_ptr__,&local_88.filename,&local_104,&local_112,&local_100,
                 __args_4);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_a8);
    }
    iVar3._begin.m_val = index.m_val + 1;
    iVar3._end.m_val = 0;
  }
  return (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *)
         (vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<create_file_entry> convert_file_storage(file_storage const& fs)
	{
		std::vector<create_file_entry> ret;
		ret.reserve(static_cast<std::size_t>(fs.num_files()));
		for (auto const i : fs.file_range())
		{
			if (fs.file_flags(i) & file_storage::flag_symlink)
				ret.emplace_back(fs.file_path(i), 0, fs.file_flags(i), fs.mtime(i), fs.internal_symlink(i));
			else
				ret.push_back({fs.file_path(i), fs.file_size(i), fs.file_flags(i), fs.mtime(i), {}});
		}
		return ret;
	}